

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O0

void __thiscall CBroadcast::RenderServerBroadcast(CBroadcast *this)

{
  bool bVar1;
  CConfig *pCVar2;
  IClient *this_00;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  long lVar5;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  CTextBoundingBox CVar8;
  CBroadcastSegment *pSegment;
  int i;
  float Rounding;
  float TextHeight;
  float Fade;
  float Width;
  float Height;
  float DeltaTime;
  float DisplayStartFade;
  float DisplayDuration;
  vec2 ShadowOffset;
  CUIRect BroadcastView;
  float a;
  float x;
  CTextCursor *in_stack_ffffffffffffff50;
  CTextCursor *this_01;
  int local_7c;
  float fStack_68;
  vec4 *in_stack_ffffffffffffffc0;
  CUIRect *in_stack_ffffffffffffffc8;
  vector2_base<float> local_30;
  float local_18;
  float local_14;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_10;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 local_c;
  vec2 local_8;
  
  local_8 = *(vec2 *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RDI;
  pCVar2 = CComponent::Config((CComponent *)0x149320);
  if ((((pCVar2->m_ClShowServerBroadcast != 0) && ((*(byte *)(in_RDI + 0x4ec) & 1) == 0)) &&
      (bVar1 = CTextCursor::Rendered((CTextCursor *)0x149348), bVar1)) &&
     (bVar1 = CChat::IsActive(*(CChat **)(*(long *)(in_RDI + 8) + 0x1b1e0)), !bVar1)) {
    this_00 = CComponent::Client((CComponent *)0x149397);
    fVar6 = IClient::LocalTime(this_00);
    fVar6 = fVar6 - *(float *)(in_RDI + 0x4e8);
    if (fVar6 <= 10.0) {
      CComponent::Graphics((CComponent *)0x1493dc);
      fVar7 = IGraphics::ScreenAspect((IGraphics *)in_stack_ffffffffffffff50);
      x = 300.0;
      pIVar3 = CComponent::Graphics((CComponent *)0x149406);
      a = 0.0;
      (*(pIVar3->super_IInterface)._vptr_IInterface[5])(0,0,fVar7 * 300.0,x);
      fVar6 = maximum<float>(a,fVar6 + -9.0);
      fVar6 = 1.0 - fVar6;
      CVar8 = CTextCursor::BoundingBox(in_stack_ffffffffffffff50);
      fStack_68 = CVar8.h;
      local_10.x = fVar7 * 300.0 * 0.5;
      fVar7 = maximum<float>(fStack_68,10.0);
      local_c.y = fVar7 + 2.0;
      local_18 = local_10.x * 0.5;
      local_14 = x - local_c.y;
      this_01 = (CTextCursor *)&stack0xffffffffffffffd8;
      vector4_base<float>::vector4_base((vector4_base<float> *)this_01,a,a,a,fVar6 * 0.25);
      CUIRect::Draw(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    (float)((ulong)lVar5 >> 0x20),(int)lVar5);
      vector2_base<float>::vector2_base(&local_30,1.0,2.0);
      CTextCursor::MoveTo(this_01,x,a);
      pIVar4 = CComponent::TextRender((CComponent *)0x1495e3);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x11])
                (local_30,(ulong)(uint)fVar6,pIVar4,in_RDI + 0x480,0,(ulong)*(uint *)(in_RDI + 0x80)
                );
      for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x47c); local_7c = local_7c + 1) {
        lVar5 = in_RDI + 0x7c + (long)local_7c * 8;
        if ((*(byte *)(in_RDI + 0x7c + (long)local_7c * 8) & 1) == 0) {
          pIVar4 = CComponent::TextRender((CComponent *)0x1496ad);
          (*(pIVar4->super_IInterface)._vptr_IInterface[0x11])
                    (local_30,(ulong)(uint)fVar6,pIVar4,in_RDI + 0x480,(ulong)*(uint *)(lVar5 + 4),
                     (ulong)*(uint *)(lVar5 + 0xc));
        }
        else {
          pIVar4 = CComponent::TextRender((CComponent *)0x149673);
          (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
                    ((ulong)(uint)fVar6,pIVar4,in_RDI + 0x480,(ulong)*(uint *)(lVar5 + 4),
                     (ulong)*(uint *)(lVar5 + 0xc));
        }
      }
    }
  }
  if (*(vec2 *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBroadcast::RenderServerBroadcast()
{
	if(!Config()->m_ClShowServerBroadcast || m_MuteServerBroadcast || !m_ServerBroadcastCursor.Rendered())
		return;
	if(m_pClient->m_pChat->IsActive())
		return;

	const float DisplayDuration = 10.0f;
	const float DisplayStartFade = 9.0f;
	const float DeltaTime = Client()->LocalTime() - m_ServerBroadcastReceivedTime;

	if(DeltaTime > DisplayDuration)
		return;

	const float Height = 300;
	const float Width = Height*Graphics()->ScreenAspect();
	Graphics()->MapScreen(0, 0, Width, Height);

	const float Fade = 1.0f - maximum(0.0f, (DeltaTime - DisplayStartFade) / (DisplayDuration - DisplayStartFade));
	const float TextHeight = m_ServerBroadcastCursor.BoundingBox().h;
	const float Rounding = 5.0f;

	CUIRect BroadcastView;
	BroadcastView.w = Width * 0.5f;
	BroadcastView.h = maximum(TextHeight, 2*Rounding) + 2.0f;
	BroadcastView.x = BroadcastView.w * 0.5f;
	BroadcastView.y = Height - BroadcastView.h;

	BroadcastView.Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f * Fade), Rounding, CUIRect::CORNER_T);

	// draw lines
	const vec2 ShadowOffset(1.0f, 2.0f);
	m_ServerBroadcastCursor.MoveTo(BroadcastView.x + BroadcastView.w/2, BroadcastView.y + BroadcastView.h/2 - TextHeight/2);

	TextRender()->DrawTextShadowed(&m_ServerBroadcastCursor, ShadowOffset, Fade, 0, m_aServerBroadcastSegments[0].m_GlyphPos);
	for(int i = 0; i < m_NumSegments; ++i)
	{
		CBroadcastSegment *pSegment = &m_aServerBroadcastSegments[i];
		if(m_aServerBroadcastSegments[i].m_IsHighContrast)
			TextRender()->DrawTextOutlined(&m_ServerBroadcastCursor, Fade, pSegment->m_GlyphPos, (pSegment+1)->m_GlyphPos);
		else
			TextRender()->DrawTextShadowed(&m_ServerBroadcastCursor, ShadowOffset, Fade, pSegment->m_GlyphPos, (pSegment+1)->m_GlyphPos);
	}
}